

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O3

int __thiscall re2::Compiler::AllocInst(Compiler *this,int n)

{
  Inst *__src;
  Inst *__s;
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  if (this->failed_ == false) {
    iVar3 = this->inst_len_;
    iVar4 = iVar3 + n;
    if (iVar4 <= this->max_inst_) {
      iVar2 = this->inst_cap_;
      if (iVar2 < iVar4) {
        if (iVar2 == 0) {
          this->inst_cap_ = 8;
          iVar2 = 8;
        }
        if (iVar2 < iVar4) {
          do {
            iVar2 = iVar2 * 2;
          } while (iVar2 < iVar4);
          this->inst_cap_ = iVar2;
        }
        uVar1 = 0xffffffffffffffff;
        if (-1 < iVar2) {
          uVar1 = (long)iVar2 * 8;
        }
        __s = (Inst *)operator_new__(uVar1);
        if (iVar2 != 0) {
          memset(__s,0,(long)iVar2 * 8);
        }
        __src = this->inst_;
        memmove(__s,__src,(long)iVar3 * 8);
        memset(__s + iVar3,0,(long)(iVar2 - iVar3) << 3);
        if (__src != (Inst *)0x0) {
          operator_delete__(__src);
          iVar3 = this->inst_len_;
          iVar4 = n + iVar3;
        }
        this->inst_ = __s;
      }
      this->inst_len_ = iVar4;
      return iVar3;
    }
  }
  this->failed_ = true;
  return -1;
}

Assistant:

int Compiler::AllocInst(int n) {
  if (failed_ || inst_len_ + n > max_inst_) {
    failed_ = true;
    return -1;
  }

  if (inst_len_ + n > inst_cap_) {
    if (inst_cap_ == 0)
      inst_cap_ = 8;
    while (inst_len_ + n > inst_cap_)
      inst_cap_ *= 2;
    Prog::Inst* ip = new Prog::Inst[inst_cap_];
    memmove(ip, inst_, inst_len_ * sizeof ip[0]);
    memset(ip + inst_len_, 0, (inst_cap_ - inst_len_) * sizeof ip[0]);
    delete[] inst_;
    inst_ = ip;
  }
  int id = inst_len_;
  inst_len_ += n;
  return id;
}